

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXProperties.cpp
# Opt level: O0

string * __thiscall
Assimp::FBX::(anonymous_namespace)::PeekPropertyName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Element *element)

{
  size_type sVar1;
  const_reference ppTVar2;
  Token *t;
  allocator<char> local_21;
  vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_> *local_20;
  TokenList *tok;
  Element *element_local;
  
  tok = (TokenList *)this;
  element_local = (Element *)__return_storage_ptr__;
  local_20 = Element::Tokens((Element *)this);
  sVar1 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::size
                    (local_20);
  if (sVar1 < 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  else {
    ppTVar2 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
              operator[](local_20,0);
    ParseTokenAsString_abi_cxx11_(__return_storage_ptr__,(FBX *)*ppTVar2,t);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PeekPropertyName(const Element& element)
{
    ai_assert(element.KeyToken().StringContents() == "P");
    const TokenList& tok = element.Tokens();
    if(tok.size() < 4) {
        return "";
    }

    return ParseTokenAsString(*tok[0]);
}